

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena.h
# Opt level: O0

void * __thiscall google::protobuf::Arena::AllocateAligned(Arena *this,size_t size,size_t align)

{
  size_t n;
  void *ptr;
  ArenaAlign local_38;
  ArenaAlign align_as;
  size_t align_local;
  size_t size_local;
  Arena *this_local;
  
  align_as.align = align;
  if (align < 9) {
    this_local = (Arena *)Allocate(this,size + 7 & 0xfffffffffffffff8);
  }
  else {
    local_38 = internal::ArenaAlignAs(align);
    n = internal::ArenaAlign::Padded(&local_38,size);
    ptr = Allocate(this,n);
    this_local = (Arena *)internal::ArenaAlign::Ceil<void>(&local_38,ptr);
  }
  return this_local;
}

Assistant:

void* PROTOBUF_NONNULL AllocateAligned(size_t size, size_t align = 8) {
    if (align <= internal::ArenaAlignDefault::align) {
      return Allocate(internal::ArenaAlignDefault::Ceil(size));
    } else {
      // We are wasting space by over allocating align - 8 bytes. Compared
      // to a dedicated function that takes current alignment in consideration.
      // Such a scheme would only waste (align - 8)/2 bytes on average, but
      // requires a dedicated function in the outline arena allocation
      // functions. Possibly re-evaluate tradeoffs later.
      auto align_as = internal::ArenaAlignAs(align);
      return align_as.Ceil(Allocate(align_as.Padded(size)));
    }
  }